

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_compressor.h
# Opt level: O0

exr_result_t DwaCompressor_compress(DwaCompressor *me)

{
  uint8_t uVar1;
  undefined8 *__s;
  ChannelData *pCVar2;
  exr_coding_channel_info_t *peVar3;
  uint8_t *puVar4;
  exr_result_t eVar5;
  long *plVar6;
  long *plVar7;
  long *plVar8;
  long *plVar9;
  CscChannelSet *pCVar10;
  size_t __n;
  uint64_t uVar11;
  DwaCompressor *in_RDI;
  size_t compBytes_1;
  size_t uncompBytes;
  size_t compBytes;
  size_t destLen;
  size_t sourceLen;
  size_t outDataSize;
  size_t outSize;
  size_t y_2;
  DctCoderChannelData *dcd_1;
  size_t scanlineSize;
  int byte;
  int x;
  uint8_t *row;
  size_t y_1;
  DctCoderChannelData *dcd;
  unsigned_short *nonlinearLut;
  LossyDctEncoder enc_1;
  exr_coding_channel_info_t *pchan;
  ChannelData *cd_1;
  int chan_1;
  CscChannelSet *cset;
  LossyDctEncoder enc;
  int csc;
  exr_coding_channel_info_t *chan;
  ChannelData *cd;
  int c_1;
  int y;
  int c;
  uint8_t *inDataPtr;
  uint8_t *outDataPtr;
  uint8_t *packedDcEnd;
  uint8_t *packedAcEnd;
  uint64_t *acCompression;
  uint64_t *totalDcUncompressedCount;
  uint64_t *totalAcUncompressedCount;
  uint64_t *rleRawSize;
  uint64_t *rleUncompressedSize;
  uint64_t *rleCompressedSize;
  uint64_t *dcCompressedSize;
  uint64_t *acCompressedSize;
  uint64_t *unknownCompressedSize;
  uint64_t *unknownUncompressedSize;
  uint64_t *version;
  uint64_t fileVersion;
  uint64_t nAvail;
  uint64_t nWritten;
  uint64_t dataBytes;
  size_t outBufferSize;
  uint64_t *sizes;
  uint8_t *outPtr;
  exr_result_t rv;
  uint16_t *in_stack_fffffffffffff728;
  int32_t in_stack_fffffffffffff730;
  undefined4 in_stack_fffffffffffff734;
  int32_t in_stack_fffffffffffff738;
  undefined4 in_stack_fffffffffffff73c;
  DctCoderChannelData *in_stack_fffffffffffff740;
  DctCoderChannelData *in_stack_fffffffffffff748;
  LossyDctEncoder *in_stack_fffffffffffff750;
  void **in_stack_fffffffffffff758;
  uint64_t *puVar12;
  LossyDctEncoder *in_stack_fffffffffffff760;
  undefined4 in_stack_fffffffffffff768;
  int in_stack_fffffffffffff76c;
  uint64_t *in_stack_fffffffffffff770;
  int level;
  exr_const_context_t_conflict in_stack_fffffffffffff778;
  uint8_t **in_stack_fffffffffffff780;
  DwaCompressor *in_stack_fffffffffffff788;
  size_t *in_stack_fffffffffffff790;
  void *in_stack_fffffffffffff7a0;
  uint in_stack_fffffffffffff7a8;
  exr_const_context_t_conflict in_stack_fffffffffffff7b0;
  uint8_t *in_stack_fffffffffffff7b8;
  void *in_stack_fffffffffffff7c0;
  uint64_t *in_stack_fffffffffffff7c8;
  long local_828;
  size_t *in_stack_fffffffffffff7e0;
  DwaCompressor *in_stack_fffffffffffff7e8;
  long local_810;
  long local_7f8;
  ulong local_7f0;
  int local_7d8;
  int local_7d4;
  uint8_t *local_7d0;
  ulong local_7c8;
  LossyDctEncoder *in_stack_fffffffffffff858;
  _func_void_void_ptr *in_stack_fffffffffffff860;
  _func_void_ptr_size_t *in_stack_fffffffffffff868;
  int local_44c;
  long local_438;
  long local_430;
  int local_ec;
  int local_d4;
  int local_d0;
  int local_cc;
  uint64_t *local_c0;
  ulong local_40;
  exr_result_t local_14;
  exr_result_t local_4;
  
  in_RDI->_channelRules = sDefaultChannelRules;
  in_RDI->_channelRuleCount = 0xf;
  DwaCompressor_initializeBuffers(in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0);
  if (in_RDI->_encode->compressed_alloc_size < 0x58) {
    local_4 = 1;
  }
  else {
    local_4 = internal_encode_alloc_buffer
                        ((exr_encode_pipeline_t *)
                         CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768),
                         (exr_transcoding_pipeline_buffer_id_t)
                         ((ulong)in_stack_fffffffffffff760 >> 0x20),in_stack_fffffffffffff758,
                         (size_t *)in_stack_fffffffffffff750,(size_t)in_stack_fffffffffffff748);
    if (local_4 == 0) {
      __s = (undefined8 *)in_RDI->_encode->compressed_buffer;
      memset(__s,0,in_RDI->_encode->compressed_alloc_size);
      plVar6 = __s + 1;
      plVar7 = __s + 3;
      puVar12 = __s + 7;
      plVar8 = __s + 8;
      plVar9 = __s + 9;
      local_c0 = __s + 0xb;
      eVar5 = DwaCompressor_writeRelevantChannelRules
                        (in_stack_fffffffffffff788,in_stack_fffffffffffff780,
                         (uint64_t)in_stack_fffffffffffff778,in_stack_fffffffffffff770);
      local_40 = 0x58;
      if ((eVar5 == 0) && (0x58 < in_RDI->_encode->compressed_alloc_size)) {
        *__s = 2;
        __s[10] = (ulong)in_RDI->_acCompression;
        local_14 = DwaCompressor_setupChannelData(in_RDI);
        local_4 = local_14;
        if (local_14 == 0) {
          for (local_cc = 0; local_cc < in_RDI->_numChannels; local_cc = local_cc + 1) {
            in_RDI->_channelData[local_cc].processed = 0;
          }
          for (local_d0 = in_RDI->_min[1]; local_d0 <= in_RDI->_max[1]; local_d0 = local_d0 + 1) {
            for (local_d4 = 0; local_d4 < in_RDI->_numChannels; local_d4 = local_d4 + 1) {
              if ((local_d0 % (in_RDI->_channelData[local_d4].chan)->y_samples == 0) &&
                 (local_14 = DctCoderChannelData_push_row
                                       ((_func_void_ptr_size_t *)in_stack_fffffffffffff758,
                                        (_func_void_void_ptr *)in_stack_fffffffffffff750,
                                        in_stack_fffffffffffff748,
                                        (uint8_t *)in_stack_fffffffffffff740), local_14 != 0)) {
                return local_14;
              }
            }
          }
          for (local_ec = 0; local_ec < in_RDI->_numCscChannelSets; local_ec = local_ec + 1) {
            pCVar10 = in_RDI->_cscChannelSets + local_ec;
            in_stack_fffffffffffff730 = (in_RDI->_channelData[pCVar10->idx[0]].chan)->width;
            in_stack_fffffffffffff738 = (in_RDI->_channelData[pCVar10->idx[0]].chan)->height;
            in_stack_fffffffffffff728 = (uint16_t *)0x0;
            local_14 = LossyDctEncoderCsc_construct
                                 (in_stack_fffffffffffff760,
                                  (float)((ulong)in_stack_fffffffffffff758 >> 0x20),
                                  (DctCoderChannelData *)in_stack_fffffffffffff750,
                                  in_stack_fffffffffffff748,in_stack_fffffffffffff740,
                                  (uint8_t *)
                                  CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738),
                                  (uint8_t *)
                                  CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730),
                                  (uint16_t *)in_stack_fffffffffffff770,
                                  (int)in_stack_fffffffffffff778,(int)in_stack_fffffffffffff780);
            if (local_14 == 0) {
              local_14 = LossyDctEncoder_execute
                                   (in_stack_fffffffffffff868,in_stack_fffffffffffff860,
                                    in_stack_fffffffffffff858);
            }
            *plVar8 = *plVar8 + local_438;
            *plVar9 = *plVar9 + local_430;
            in_RDI->_channelData[pCVar10->idx[0]].processed = 1;
            in_RDI->_channelData[pCVar10->idx[1]].processed = 1;
            in_RDI->_channelData[pCVar10->idx[2]].processed = 1;
            if (local_14 != 0) {
              return local_14;
            }
          }
          for (local_44c = 0; level = (int)((ulong)in_stack_fffffffffffff770 >> 0x20),
              local_44c < in_RDI->_numChannels; local_44c = local_44c + 1) {
            pCVar2 = in_RDI->_channelData;
            peVar3 = pCVar2[local_44c].chan;
            if (pCVar2[local_44c].processed == 0) {
              switch(pCVar2[local_44c].compression) {
              case UNKNOWN:
                __n = (long)peVar3->width * (long)peVar3->bytes_per_element;
                for (local_7f0 = 0; local_7f0 < pCVar2[local_44c]._dctData._size;
                    local_7f0 = local_7f0 + 1) {
                  memcpy(pCVar2[local_44c].planarUncBufferEnd,
                         pCVar2[local_44c]._dctData._rows[local_7f0],__n);
                  pCVar2[local_44c].planarUncBufferEnd = pCVar2[local_44c].planarUncBufferEnd + __n;
                }
                *plVar6 = pCVar2[local_44c].planarUncSize + *plVar6;
                break;
              case LOSSY_DCT:
                in_stack_fffffffffffff728 =
                     (uint16_t *)
                     CONCAT44((int)((ulong)in_stack_fffffffffffff728 >> 0x20),peVar3->height);
                local_14 = LossyDctEncoder_construct
                                     (in_stack_fffffffffffff750,
                                      (float)((ulong)in_stack_fffffffffffff748 >> 0x20),
                                      in_stack_fffffffffffff740,
                                      (uint8_t *)
                                      CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738),
                                      (uint8_t *)
                                      CONCAT44(in_stack_fffffffffffff734,in_stack_fffffffffffff730),
                                      in_stack_fffffffffffff728,0,(int)in_stack_fffffffffffff760);
                if (local_14 == 0) {
                  local_14 = LossyDctEncoder_execute
                                       (in_stack_fffffffffffff868,in_stack_fffffffffffff860,
                                        in_stack_fffffffffffff858);
                }
                *plVar8 = (long)in_stack_fffffffffffff858->_channel_encode_data + *plVar8 + -0x18;
                *plVar9 = (long)(in_stack_fffffffffffff860 + *plVar9);
                if (local_14 != 0) {
                  return local_14;
                }
                break;
              case RLE:
                for (local_7c8 = 0; local_7c8 < pCVar2[local_44c]._dctData._size;
                    local_7c8 = local_7c8 + 1) {
                  local_7d0 = pCVar2[local_44c]._dctData._rows[local_7c8];
                  for (local_7d4 = 0; local_7d4 < peVar3->width; local_7d4 = local_7d4 + 1) {
                    for (local_7d8 = 0; local_7d8 < peVar3->bytes_per_element;
                        local_7d8 = local_7d8 + 1) {
                      uVar1 = *local_7d0;
                      puVar4 = pCVar2[local_44c].planarUncRleEnd[local_7d8];
                      pCVar2[local_44c].planarUncRleEnd[local_7d8] = puVar4 + 1;
                      *puVar4 = uVar1;
                      local_7d0 = local_7d0 + 1;
                    }
                  }
                  *puVar12 = (long)peVar3->width * (long)peVar3->bytes_per_element + *puVar12;
                }
                break;
              case NUM_COMPRESSOR_SCHEMES:
              default:
                return 3;
              }
              pCVar2[local_44c].processed = 1;
            }
          }
          if (*plVar6 != 0) {
            in_stack_fffffffffffff7b0 = in_RDI->_encode->context;
            in_stack_fffffffffffff7b8 = in_RDI->_planarUncBuffer[0];
            in_stack_fffffffffffff7c0 = (void *)*plVar6;
            in_stack_fffffffffffff7c8 = local_c0;
            exr_compress_max_buffer_size((size_t)in_stack_fffffffffffff748);
            eVar5 = exr_compress_buffer(in_stack_fffffffffffff778,level,
                                        (void *)CONCAT44(in_stack_fffffffffffff76c,
                                                         in_stack_fffffffffffff768),
                                        (size_t)in_stack_fffffffffffff760,in_stack_fffffffffffff758,
                                        (size_t)in_stack_fffffffffffff750,in_stack_fffffffffffff790)
            ;
            if (eVar5 != 0) {
              return eVar5;
            }
            local_c0 = (uint64_t *)(local_7f8 + (long)local_c0);
            __s[2] = local_7f8;
            local_40 = local_7f8 + 0x58;
            local_14 = 0;
          }
          if (*plVar8 != 0) {
            if (in_RDI->_acCompression == STATIC_HUFFMAN) {
              local_14 = internal_huf_compress
                                   (in_stack_fffffffffffff7c8,in_stack_fffffffffffff7c0,
                                    (uint64_t)in_stack_fffffffffffff7b8,
                                    (uint16_t *)in_stack_fffffffffffff7b0,
                                    (ulong)in_stack_fffffffffffff7a8,in_stack_fffffffffffff7a0,
                                    (uint64_t)in_stack_fffffffffffff7e0);
              if (local_14 != 0) {
                if (local_14 != 4) {
                  return local_14;
                }
                memcpy(in_RDI->_encode->compressed_buffer,in_RDI->_encode->packed_buffer,
                       in_RDI->_encode->packed_alloc_size);
                in_RDI->_encode->compressed_bytes = in_RDI->_encode->packed_alloc_size;
                return 0;
              }
            }
            else {
              if (in_RDI->_acCompression != DEFLATE) {
                return 3;
              }
              in_stack_fffffffffffff790 = (size_t *)in_RDI->_packedAcBuffer;
              exr_compress_max_buffer_size((size_t)in_stack_fffffffffffff748);
              eVar5 = exr_compress_buffer(in_stack_fffffffffffff778,level,
                                          (void *)CONCAT44(in_stack_fffffffffffff76c,
                                                           in_stack_fffffffffffff768),
                                          (size_t)in_stack_fffffffffffff760,
                                          in_stack_fffffffffffff758,
                                          (size_t)in_stack_fffffffffffff750,
                                          in_stack_fffffffffffff790);
              if (eVar5 != 0) {
                return eVar5;
              }
              *plVar7 = local_810;
              local_14 = 0;
            }
            local_c0 = (uint64_t *)(*plVar7 + (long)local_c0);
            local_40 = *plVar7 + local_40;
          }
          if (*plVar9 != 0) {
            in_stack_fffffffffffff778 = (exr_const_context_t_conflict)(*plVar9 << 1);
            eVar5 = internal_encode_alloc_buffer
                              ((exr_encode_pipeline_t *)
                               CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768),
                               (exr_transcoding_pipeline_buffer_id_t)
                               ((ulong)in_stack_fffffffffffff760 >> 0x20),in_stack_fffffffffffff758,
                               (size_t *)in_stack_fffffffffffff750,(size_t)in_stack_fffffffffffff748
                              );
            if (eVar5 != 0) {
              return eVar5;
            }
            internal_zip_deconstruct_bytes
                      ((uint8_t *)in_RDI->_encode->scratch_buffer_1,in_RDI->_packedDcBuffer,
                       (uint64_t)in_stack_fffffffffffff778);
            in_stack_fffffffffffff760 = (LossyDctEncoder *)in_RDI->_encode->context;
            in_stack_fffffffffffff76c = in_RDI->_zipLevel;
            level = (int)((ulong)in_RDI->_encode->scratch_buffer_1 >> 0x20);
            exr_compress_max_buffer_size((size_t)in_stack_fffffffffffff748);
            eVar5 = exr_compress_buffer(in_stack_fffffffffffff778,level,
                                        (void *)CONCAT44(in_stack_fffffffffffff76c,
                                                         in_stack_fffffffffffff768),
                                        (size_t)in_stack_fffffffffffff760,in_stack_fffffffffffff758,
                                        (size_t)in_stack_fffffffffffff750,in_stack_fffffffffffff790)
            ;
            if (eVar5 != 0) {
              return eVar5;
            }
            __s[4] = in_stack_fffffffffffff7e8;
            local_c0 = (uint64_t *)((long)local_c0 + (long)(in_stack_fffffffffffff7e8->_min + -6));
            local_40 = (long)in_stack_fffffffffffff7e8->_min + (local_40 - 0x18);
            local_14 = 0;
          }
          if (*puVar12 != 0) {
            uVar11 = internal_rle_compress
                               (in_RDI->_rleBuffer,in_RDI->_rleBufferSize,
                                in_RDI->_planarUncBuffer[2],*puVar12);
            __s[6] = uVar11;
            uVar11 = __s[6];
            puVar12 = local_c0;
            exr_compress_max_buffer_size((size_t)in_RDI->_rleBuffer);
            eVar5 = exr_compress_buffer(in_stack_fffffffffffff778,level,
                                        (void *)CONCAT44(in_stack_fffffffffffff76c,
                                                         in_stack_fffffffffffff768),
                                        (size_t)in_stack_fffffffffffff760,puVar12,uVar11,
                                        in_stack_fffffffffffff790);
            if (eVar5 != 0) {
              return eVar5;
            }
            __s[5] = local_828;
            local_c0 = (uint64_t *)(local_828 + (long)local_c0);
            local_40 = local_828 + local_40;
            local_14 = 0;
          }
          priv_from_native64(__s,0xb);
          if (local_40 == (long)local_c0 - (long)in_RDI->_encode->compressed_buffer) {
            if (local_40 < in_RDI->_encode->packed_bytes) {
              in_RDI->_encode->compressed_bytes = local_40;
            }
            else {
              memcpy(in_RDI->_encode->compressed_buffer,in_RDI->_encode->packed_buffer,
                     in_RDI->_encode->packed_bytes);
              in_RDI->_encode->compressed_bytes = in_RDI->_encode->packed_bytes;
            }
            local_4 = local_14;
          }
          else {
            local_4 = 0x17;
          }
        }
      }
      else {
        local_4 = 1;
      }
    }
  }
  return local_4;
}

Assistant:

exr_result_t
DwaCompressor_compress (DwaCompressor* me)
{
    exr_result_t rv;
    uint8_t*     outPtr;
    uint64_t*    sizes;
    size_t       outBufferSize = 0;
    uint64_t     dataBytes, nWritten = 0;
    uint64_t     nAvail;
    uint64_t     fileVersion = 2;
    uint64_t*    version;
    uint64_t*    unknownUncompressedSize;
    uint64_t*    unknownCompressedSize;
    uint64_t*    acCompressedSize;
    uint64_t*    dcCompressedSize;
    uint64_t*    rleCompressedSize;
    uint64_t*    rleUncompressedSize;
    uint64_t*    rleRawSize;

    uint64_t* totalAcUncompressedCount;
    uint64_t* totalDcUncompressedCount;

    uint64_t* acCompression;
    uint8_t*  packedAcEnd;
    uint8_t*  packedDcEnd;
    uint8_t*  outDataPtr;
    uint8_t*  inDataPtr;

    // Starting with DWA v2, we write the channel
    // classification rules into the file
    me->_channelRules     = sDefaultChannelRules;
    me->_channelRuleCount = sizeof (sDefaultChannelRules) / sizeof (Classifier);

    rv = DwaCompressor_initializeBuffers (me, &outBufferSize);

    nAvail = me->_encode->compressed_alloc_size;
    if (nAvail < (NUM_SIZES_SINGLE * sizeof (uint64_t)))
        return EXR_ERR_OUT_OF_MEMORY;

    rv = internal_encode_alloc_buffer (
        me->_encode,
        EXR_TRANSCODE_BUFFER_SCRATCH1,
        &(me->_encode->compressed_buffer),
        &(me->_encode->compressed_alloc_size),
        outBufferSize);
    if (rv != EXR_ERR_SUCCESS) return rv;

    nAvail = outBufferSize;
    sizes  = (uint64_t*) me->_encode->compressed_buffer;

    //
    // Zero all the numbers in the chunk header
    //
    //    memset (sizes, 0, NUM_SIZES_SINGLE * sizeof (uint64_t));
    memset (sizes, 0, me->_encode->compressed_alloc_size);

#define OBIDX(x) (uint64_t*) (sizes + x)

    version                 = OBIDX (VERSION);
    unknownUncompressedSize = OBIDX (UNKNOWN_UNCOMPRESSED_SIZE);
    unknownCompressedSize   = OBIDX (UNKNOWN_COMPRESSED_SIZE);
    acCompressedSize        = OBIDX (AC_COMPRESSED_SIZE);
    dcCompressedSize        = OBIDX (DC_COMPRESSED_SIZE);
    rleCompressedSize       = OBIDX (RLE_COMPRESSED_SIZE);
    rleUncompressedSize     = OBIDX (RLE_UNCOMPRESSED_SIZE);
    rleRawSize              = OBIDX (RLE_RAW_SIZE);

    totalAcUncompressedCount = OBIDX (AC_UNCOMPRESSED_COUNT);
    totalDcUncompressedCount = OBIDX (DC_UNCOMPRESSED_COUNT);

    acCompression = OBIDX (AC_COMPRESSION);
    packedAcEnd   = NULL;
    packedDcEnd   = NULL;

    // Now write in the channel rules...
    outPtr = (uint8_t*) (sizes + NUM_SIZES_SINGLE);
    if (rv == EXR_ERR_SUCCESS && fileVersion >= 2)
    {
        rv = DwaCompressor_writeRelevantChannelRules (
            me, &outPtr, nAvail, &nWritten);
    }

    // post add this so we have a 0 value for the relevant channel
    // rules to fill up
    nWritten += NUM_SIZES_SINGLE * sizeof (uint64_t);

    if (rv != EXR_ERR_SUCCESS || nWritten >= me->_encode->compressed_alloc_size)
        return EXR_ERR_OUT_OF_MEMORY;

    outDataPtr = outPtr;

    //
    // We might not be dealing with any color data, in which
    // case the AC buffer size will be 0, and dereferencing
    // a vector will not be a good thing to do.
    //

    if (me->_packedAcBuffer) packedAcEnd = me->_packedAcBuffer;
    if (me->_packedDcBuffer) packedDcEnd = me->_packedDcBuffer;

    //
    // Setup the AC compression strategy and the version in the data block,
    // then write the relevant channel classification rules if needed
    //
    *version       = fileVersion;
    *acCompression = me->_acCompression;

    rv = DwaCompressor_setupChannelData (me);
    if (rv != EXR_ERR_SUCCESS) return rv;

    //
    // Determine the start of each row in the input buffer
    // Channels are interleaved by scanline
    //
    for (int c = 0; c < me->_numChannels; ++c)
    {
        me->_channelData[c].processed = 0;
    }

    inDataPtr = me->_encode->packed_buffer;

    for (int y = me->_min[1]; y <= me->_max[1]; ++y)
    {
        for (int c = 0; c < me->_numChannels; ++c)
        {
            ChannelData*               cd   = &(me->_channelData[c]);
            exr_coding_channel_info_t* chan = cd->chan;

            if ((y % chan->y_samples) != 0) continue;

            rv = DctCoderChannelData_push_row (
                me->alloc_fn, me->free_fn, &(cd->_dctData), inDataPtr);
            if (rv != EXR_ERR_SUCCESS) return rv;

            inDataPtr += chan->width * chan->bytes_per_element;
        }
    }

    //
    // Make a pass over all our CSC sets and try to encode them first
    //

    for (int csc = 0; csc < me->_numCscChannelSets; ++csc)
    {
        LossyDctEncoder enc;
        CscChannelSet*  cset = &(me->_cscChannelSets[csc]);

        rv = LossyDctEncoderCsc_construct (
            &enc,
            me->_dwaCompressionLevel / 100000.f,
            &(me->_channelData[cset->idx[0]]._dctData),
            &(me->_channelData[cset->idx[1]]._dctData),
            &(me->_channelData[cset->idx[2]]._dctData),
            packedAcEnd,
            packedDcEnd,
            dwaCompressorToNonlinear,
            me->_channelData[cset->idx[0]].chan->width,
            me->_channelData[cset->idx[0]].chan->height);

        if (rv == EXR_ERR_SUCCESS)
            rv = LossyDctEncoder_execute (me->alloc_fn, me->free_fn, &enc);

        *totalAcUncompressedCount = *totalAcUncompressedCount + enc._numAcComp;
        *totalDcUncompressedCount = *totalDcUncompressedCount + enc._numDcComp;

        packedAcEnd += enc._numAcComp * sizeof (uint16_t);
        packedDcEnd += enc._numDcComp * sizeof (uint16_t);

        me->_channelData[cset->idx[0]].processed = 1;
        me->_channelData[cset->idx[1]].processed = 1;
        me->_channelData[cset->idx[2]].processed = 1;

        if (rv != EXR_ERR_SUCCESS) return rv;
    }

    for (int chan = 0; chan < me->_numChannels; ++chan)
    {
        ChannelData*               cd    = &(me->_channelData[chan]);
        exr_coding_channel_info_t* pchan = cd->chan;

        if (cd->processed) continue;

        switch (cd->compression)
        {
            case LOSSY_DCT:
                //
                // For LOSSY_DCT, treat this just like the CSC'd case,
                // but only operate on one channel
                //
                {
                    LossyDctEncoder       enc;
                    const unsigned short* nonlinearLut = NULL;

                    if (!pchan->p_linear)
                        nonlinearLut = dwaCompressorToNonlinear;

                    rv = LossyDctEncoder_construct (
                        &enc,
                        me->_dwaCompressionLevel / 100000.f,
                        &(cd->_dctData),
                        packedAcEnd,
                        packedDcEnd,
                        nonlinearLut,
                        pchan->width,
                        pchan->height);

                    if (rv == EXR_ERR_SUCCESS)
                        rv = LossyDctEncoder_execute (
                            me->alloc_fn, me->free_fn, &enc);

                    *totalAcUncompressedCount =
                        *totalAcUncompressedCount + enc._numAcComp;
                    *totalDcUncompressedCount =
                        *totalDcUncompressedCount + enc._numDcComp;

                    packedAcEnd += enc._numAcComp * sizeof (uint16_t);
                    packedDcEnd += enc._numDcComp * sizeof (uint16_t);

                    if (rv != EXR_ERR_SUCCESS) return rv;
                }
                break;

            case RLE: {
                //
                // For RLE, bash the bytes up so that the first bytes of each
                // pixel are contiguous, as are the second bytes, and so on.
                //
                DctCoderChannelData* dcd = &(cd->_dctData);
                for (size_t y = 0; y < dcd->_size; ++y)
                {
                    const uint8_t* row = dcd->_rows[y];

                    for (int x = 0; x < pchan->width; ++x)
                    {
                        for (int byte = 0; byte < pchan->bytes_per_element;
                             ++byte)
                        {
                            *cd->planarUncRleEnd[byte]++ = *row++;
                        }
                    }

                    *rleRawSize += (uint64_t) pchan->width *
                                   (uint64_t) pchan->bytes_per_element;
                }

                break;
            }

            case UNKNOWN:

                //
                // Otherwise, just copy data over verbatim
                //

                {
                    size_t scanlineSize = (size_t) pchan->width *
                                          (size_t) pchan->bytes_per_element;
                    DctCoderChannelData* dcd = &(cd->_dctData);
                    for (size_t y = 0; y < dcd->_size; ++y)
                    {
                        memcpy (
                            cd->planarUncBufferEnd,
                            dcd->_rows[y],
                            scanlineSize);

                        cd->planarUncBufferEnd += scanlineSize;
                    }

                    *unknownUncompressedSize += cd->planarUncSize;
                }

                break;

            case NUM_COMPRESSOR_SCHEMES:
            default: return EXR_ERR_INVALID_ARGUMENT;
        }

        cd->processed = DWA_CLASSIFIER_TRUE;
    }

    //
    // Pack the Unknown data into the output buffer first. Instead of
    // just copying it uncompressed, try zlib compression at least.
    //

    if (*unknownUncompressedSize > 0)
    {
        size_t outSize;

        rv = exr_compress_buffer (
            me->_encode->context,
            9, // TODO: use default??? the old call to zlib had 9 hardcoded
            me->_planarUncBuffer[UNKNOWN],
            *unknownUncompressedSize,
            outDataPtr,
            exr_compress_max_buffer_size (*unknownUncompressedSize),
            &outSize);
        if (rv != EXR_ERR_SUCCESS) return rv;

        outDataPtr += outSize;
        *unknownCompressedSize = outSize;
        nWritten += outSize;
    }

    //
    // Now, pack all the Lossy DCT coefficients into our output
    // buffer, with Huffman encoding.
    //
    // Also, record the compressed size and the number of
    // uncompressed componentns we have.
    //

    if (*totalAcUncompressedCount > 0)
    {
        switch (me->_acCompression)
        {
            case STATIC_HUFFMAN: {
                size_t outDataSize =
                    outBufferSize -
                    (size_t) ((uintptr_t) outDataPtr - (uintptr_t) sizes);

                rv = internal_huf_compress (
                    acCompressedSize,
                    outDataPtr,
                    outDataSize,
                    (const uint16_t*) me->_packedAcBuffer,
                    *totalAcUncompressedCount,
                    me->_encode->scratch_buffer_1,
                    me->_encode->scratch_alloc_size_1);
                if (rv != EXR_ERR_SUCCESS)
                {
                    if (rv == EXR_ERR_ARGUMENT_OUT_OF_RANGE)
                    {
                        memcpy (
                            me->_encode->compressed_buffer,
                            me->_encode->packed_buffer,
                            me->_encode->packed_alloc_size);
                        me->_encode->compressed_bytes =
                            me->_encode->packed_alloc_size;
                        return EXR_ERR_SUCCESS;
                    }
                    return rv;
                }
                break;
            }

            case DEFLATE: {
                size_t sourceLen =
                    *totalAcUncompressedCount * sizeof (uint16_t);
                size_t destLen;

                rv = exr_compress_buffer (
                    me->_encode->context,
                    9, // TODO: use default??? the old call to zlib had 9 hardcoded
                    me->_packedAcBuffer,
                    sourceLen,
                    outDataPtr,
                    exr_compress_max_buffer_size (sourceLen),
                    &destLen);
                if (rv != EXR_ERR_SUCCESS) return rv;

                *acCompressedSize = destLen;
                break;
            }

            default:
                return EXR_ERR_INVALID_ARGUMENT;
                //assert (false);
        }

        outDataPtr += *acCompressedSize;
        nWritten += *acCompressedSize;
    }

    //
    // Handle the DC components separately
    //

    if (*totalDcUncompressedCount > 0)
    {
        size_t compBytes;
        size_t uncompBytes = *totalDcUncompressedCount * sizeof (uint16_t);

        rv = internal_encode_alloc_buffer (
            me->_encode,
            EXR_TRANSCODE_BUFFER_SCRATCH1,
            &(me->_encode->scratch_buffer_1),
            &(me->_encode->scratch_alloc_size_1),
            uncompBytes);

        if (rv != EXR_ERR_SUCCESS) return rv;

        internal_zip_deconstruct_bytes (
            me->_encode->scratch_buffer_1, me->_packedDcBuffer, uncompBytes);

        rv = exr_compress_buffer (
            me->_encode->context,
            me->_zipLevel,
            me->_encode->scratch_buffer_1,
            uncompBytes,
            outDataPtr,
            exr_compress_max_buffer_size (uncompBytes),
            &compBytes);

        if (rv != EXR_ERR_SUCCESS) return rv;

        *dcCompressedSize = compBytes;
        outDataPtr += compBytes;
        nWritten += compBytes;
    }

    //
    // If we have RLE data, first RLE encode it and set the uncompressed
    // size. Then, deflate the results and set the compressed size.
    //

    if (*rleRawSize > 0)
    {
        size_t compBytes;
        *rleUncompressedSize = internal_rle_compress (
            me->_rleBuffer,
            me->_rleBufferSize,
            me->_planarUncBuffer[RLE],
            *rleRawSize);

        rv = exr_compress_buffer (
            me->_encode->context,
            9, // TODO: use default??? the old call to zlib had 9 hardcoded
            me->_rleBuffer,
            *rleUncompressedSize,
            outDataPtr,
            exr_compress_max_buffer_size (*rleUncompressedSize),
            &compBytes);

        if (rv != EXR_ERR_SUCCESS) return rv;

        *rleCompressedSize = compBytes;
        outDataPtr += compBytes;
        nWritten += compBytes;
    }

    //
    // Flip the counters to XDR format
    //
    priv_from_native64 (sizes, NUM_SIZES_SINGLE);

    dataBytes =
        (uintptr_t) outDataPtr - (uintptr_t) me->_encode->compressed_buffer;
    if (nWritten != dataBytes) { return EXR_ERR_CORRUPT_CHUNK; }

    if (nWritten >= me->_encode->packed_bytes)
    {
        memcpy (
            me->_encode->compressed_buffer,
            me->_encode->packed_buffer,
            me->_encode->packed_bytes);
        me->_encode->compressed_bytes = me->_encode->packed_bytes;
    }
    else { me->_encode->compressed_bytes = nWritten; }
    return rv;
}